

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int __thiscall efsw::String::compare(String *this,size_t pos1,size_t n1,char *s,size_t n2)

{
  int iVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> bStack_48;
  
  String((String *)&bStack_48,s);
  iVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                    (&this->mString,pos1,n1,&bStack_48,0,n2);
  std::__cxx11::u32string::~u32string((u32string *)&bStack_48);
  return iVar1;
}

Assistant:

int String::compare( std::size_t pos1, std::size_t n1, const char* s, std::size_t n2 ) const {
	return compare( pos1, n1, String( s ), 0, n2 );
}